

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraphBuilder.cpp
# Opt level: O0

vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *
AssemblyCode::buildControlFlowGraph
          (vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>
           *__return_storage_ptr__,AssemblyCommands *commands)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  __shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_> *pvVar9;
  CodeLine *local_1e0;
  CodeLine *local_1b8;
  long local_1a0;
  reference local_178;
  reference local_170;
  reference local_168;
  reference local_160;
  CodeLine *nextLine;
  JumpCommand *jumpCommand;
  undefined1 local_148 [32];
  reference local_128;
  CodeLine *labelJumpLine;
  AbstractJumpCommand *abstractJumpCommand;
  int i_1;
  long local_108;
  MoveRegRegCommand *moveRegRegCommand;
  CodeLine codeLine;
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelToIndexMap;
  AssemblyCommands *commands_local;
  vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_> *lines;
  
  labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)commands;
  buildLabelMap_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&i,commands);
  codeLine._175_1_ = 0;
  std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::vector
            (__return_storage_ptr__);
  codeLine.isMoveRegReg = false;
  codeLine._169_3_ = 0;
  for (; uVar2 = (ulong)(int)codeLine._168_4_,
      sVar3 = std::
              vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              ::size((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                      *)labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count),
      uVar2 < sVar3; codeLine._168_4_ = codeLine._168_4_ + 1) {
    CodeLine::CodeLine((CodeLine *)&moveRegRegCommand);
    codeLine.command.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_1_ = codeLine.isMoveRegReg;
    codeLine.command.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._1_3_ = codeLine._169_3_;
    pvVar4 = std::
             vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
             ::operator[]((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                           *)labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (long)(int)codeLine._168_4_);
    std::shared_ptr<AssemblyCode::AssemblyCommand>::operator=
              ((shared_ptr<AssemblyCode::AssemblyCommand> *)&moveRegRegCommand,pvVar4);
    p_Var5 = &std::
              vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              ::operator[]((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                            *)labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (long)(int)codeLine._168_4_)->
              super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
    peVar6 = std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::get
                       (p_Var5);
    if (peVar6 == (element_type *)0x0) {
      local_1a0 = 0;
    }
    else {
      local_1a0 = __dynamic_cast(peVar6,&AssemblyCommand::typeinfo,&MoveRegRegCommand::typeinfo,0);
    }
    local_108 = local_1a0;
    codeLine.liveOutTemps._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = local_1a0 != 0;
    std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::push_back
              (__return_storage_ptr__,(value_type *)&moveRegRegCommand);
    CodeLine::~CodeLine((CodeLine *)&moveRegRegCommand);
  }
  for (abstractJumpCommand._0_4_ = 0; uVar2 = (ulong)(int)abstractJumpCommand,
      sVar3 = std::
              vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              ::size((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                      *)labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count),
      uVar2 < sVar3; abstractJumpCommand._0_4_ = (int)abstractJumpCommand + 1) {
    p_Var5 = &std::
              vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              ::operator[]((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                            *)labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (long)(int)abstractJumpCommand)->
              super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
    peVar6 = std::__shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>::get
                       (p_Var5);
    if (peVar6 == (element_type *)0x0) {
      local_1b8 = (CodeLine *)0x0;
    }
    else {
      local_1b8 = (CodeLine *)
                  __dynamic_cast(peVar6,&AssemblyCommand::typeinfo,&AbstractJumpCommand::typeinfo,0)
      ;
    }
    labelJumpLine = local_1b8;
    if (local_1b8 == (CodeLine *)0x0) {
      iVar1 = (int)abstractJumpCommand + 1;
      sVar3 = std::
              vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
              ::size((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                      *)labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if ((long)iVar1 != sVar3) {
        pvVar8 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                 operator[](__return_storage_ptr__,(long)(int)abstractJumpCommand);
        local_170 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                    operator[](__return_storage_ptr__,(long)((int)abstractJumpCommand + 1));
        std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                  (&pvVar8->nextLines,&local_170);
        pvVar8 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                 operator[](__return_storage_ptr__,(long)((int)abstractJumpCommand + 1));
        local_178 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                    operator[](__return_storage_ptr__,(long)(int)abstractJumpCommand);
        std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                  (&pvVar8->prevLines,&local_178);
      }
    }
    else {
      AbstractJumpCommand::getLabel_abi_cxx11_((AbstractJumpCommand *)local_148);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&i,(key_type *)local_148);
      pvVar8 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
               operator[](__return_storage_ptr__,(long)*pmVar7);
      std::__cxx11::string::~string((string *)local_148);
      local_128 = pvVar8;
      pvVar8 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
               operator[](__return_storage_ptr__,(long)(int)abstractJumpCommand);
      std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                (&pvVar8->nextLines,&local_128);
      pvVar9 = &local_128->prevLines;
      jumpCommand = (JumpCommand *)
                    std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                    operator[](__return_storage_ptr__,(long)(int)abstractJumpCommand);
      std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                (pvVar9,(value_type *)&jumpCommand);
      if (labelJumpLine == (CodeLine *)0x0) {
        local_1e0 = (CodeLine *)0x0;
      }
      else {
        local_1e0 = (CodeLine *)
                    __dynamic_cast(labelJumpLine,&AbstractJumpCommand::typeinfo,
                                   &JumpCommand::typeinfo,0);
      }
      nextLine = local_1e0;
      if ((local_1e0 == (CodeLine *)0x0) &&
         (iVar1 = (int)abstractJumpCommand + 1,
         sVar3 = std::
                 vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                 ::size((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                         *)labelToIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count),
         (long)iVar1 != sVar3)) {
        local_160 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                    operator[](__return_storage_ptr__,(long)((int)abstractJumpCommand + 1));
        pvVar8 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                 operator[](__return_storage_ptr__,(long)(int)abstractJumpCommand);
        std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                  (&pvVar8->nextLines,&local_160);
        pvVar9 = &local_160->prevLines;
        local_168 = std::vector<AssemblyCode::CodeLine,_std::allocator<AssemblyCode::CodeLine>_>::
                    operator[](__return_storage_ptr__,(long)(int)abstractJumpCommand);
        std::vector<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>::push_back
                  (pvVar9,&local_168);
      }
    }
  }
  codeLine._175_1_ = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AssemblyCode::CodeLine> AssemblyCode::buildControlFlowGraph(const AssemblyCommands &commands) {
    std::map<std::string, int> labelToIndexMap = buildLabelMap(commands);
    std::vector<AssemblyCode::CodeLine> lines;

    // fill lines
    for (int i = 0; i < commands.size(); ++i) {
        CodeLine codeLine;
        codeLine.lineNumber = i;
        codeLine.command = commands[i];

        AssemblyCode::MoveRegRegCommand* moveRegRegCommand =
                dynamic_cast<AssemblyCode::MoveRegRegCommand*>(commands[i].get());

        codeLine.isMoveRegReg = moveRegRegCommand != nullptr;

        lines.push_back(codeLine);
    }

    // build graph
    for (int i = 0; i < commands.size(); ++i) {
        const AbstractJumpCommand* abstractJumpCommand = dynamic_cast<const AbstractJumpCommand*>(commands[i].get());
        if (abstractJumpCommand != nullptr) {
            CodeLine* labelJumpLine = &lines[labelToIndexMap[abstractJumpCommand->getLabel()]];

            lines[i].nextLines.push_back(labelJumpLine);
            labelJumpLine->prevLines.push_back(&lines[i]);

            const JumpCommand* jumpCommand = dynamic_cast<const JumpCommand*>(abstractJumpCommand);
            if (jumpCommand == nullptr && (i + 1) != commands.size()) {
                // conditional jump
                CodeLine* nextLine = &lines[i + 1];
                lines[i].nextLines.push_back(nextLine);
                nextLine->prevLines.push_back(&lines[i]);
            }
        } else {
            if ((i + 1) != commands.size()) {
                lines[i].nextLines.push_back(&lines[i + 1]);
                lines[i + 1].prevLines.push_back(&lines[i]);
            }
        }
    }

    return lines;
}